

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

SyntaxKind slang::syntax::SyntaxFacts::getModuleHeaderKind(TokenKind kind)

{
  SyntaxKind local_c;
  TokenKind kind_local;
  
  switch(kind) {
  case InterfaceKeyword:
    local_c = InterfaceHeader;
    break;
  default:
    local_c = Unknown;
    break;
  case MacromoduleKeyword:
    local_c = ModuleHeader;
    break;
  case ModuleKeyword:
    local_c = ModuleHeader;
    break;
  case PackageKeyword:
    local_c = PackageHeader;
    break;
  case ProgramKeyword:
    local_c = ProgramHeader;
  }
  return local_c;
}

Assistant:

SyntaxKind SyntaxFacts::getModuleHeaderKind(TokenKind kind) {
    switch (kind) {
        case TokenKind::ModuleKeyword: return SyntaxKind::ModuleHeader;
        case TokenKind::MacromoduleKeyword: return SyntaxKind::ModuleHeader;
        case TokenKind::ProgramKeyword: return SyntaxKind::ProgramHeader;
        case TokenKind::InterfaceKeyword: return SyntaxKind::InterfaceHeader;
        case TokenKind::PackageKeyword: return SyntaxKind::PackageHeader;
        default: return SyntaxKind::Unknown;
    }
}